

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(TiledRgbaInputFile *this,char *name,int numThreads)

{
  RgbaChannels RVar1;
  TiledInputFile *this_00;
  FromYa *this_01;
  
  this->_vptr_TiledRgbaInputFile = (_func_int **)&PTR__TiledRgbaInputFile_0036b9a0;
  this_00 = (TiledInputFile *)operator_new(0x10);
  TiledInputFile::TiledInputFile(this_00,name,numThreads);
  this->_inputFile = this_00;
  this->_fromYa = (FromYa *)0x0;
  (this->_channelNamePrefix)._M_dataplus._M_p = (pointer)&(this->_channelNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_channelNamePrefix,"");
  RVar1 = channels(this);
  if (WRITE_RGBA < RVar1) {
    this_01 = (FromYa *)operator_new(0x78);
    FromYa::FromYa(this_01,this->_inputFile);
    this->_fromYa = this_01;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (const char name[], int numThreads):
    _inputFile (new TiledInputFile (name, numThreads)),
    _fromYa (0),
    _channelNamePrefix ("")
{
    if (channels() & WRITE_Y)
	_fromYa = new FromYa (*_inputFile);
}